

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_parse_function_generator.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::ParseFunctionGenerator::GenerateTailcallFieldParseFunctions
          (ParseFunctionGenerator *this,Formatter *format)

{
  LogMessage *other;
  anon_struct_16_2_3fed9ca0 *layout;
  long lVar1;
  anon_struct_16_2_3fed9ca0 kTagLayouts [2];
  char *local_88;
  int aiStack_80 [2];
  char *local_78;
  undefined8 uStack_70;
  LogMessage local_60;
  
  if (this->options_->tctable_mode == kTCTableNever) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_parse_function_generator.cc"
               ,0x196);
    other = internal::LogMessage::operator<<(&local_60,"CHECK failed: should_generate_tctable(): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_88,other);
    internal::LogMessage::~LogMessage(&local_60);
  }
  local_78 = "uint16_t";
  uStack_70 = 2;
  local_88 = "uint8_t";
  aiStack_80[0] = 1;
  aiStack_80[1] = 0;
  lVar1 = 0;
  do {
    Formatter::operator()
              (format,
               "#if PROTOBUF_TC_STATIC_PARSE_SINGULAR$1$\nconst char* $classname$::Tct_ParseS$1$(PROTOBUF_TC_PARAM_DECL) {\n  if (PROTOBUF_PREDICT_FALSE(data.coded_tag<$2$>() != 0))\n    PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);\n  ptr += $1$;\n  hasbits |= (uint64_t{1} << data.hasbit_idx());\n  ::$proto_ns$::internal::TcParser::SyncHasbits(msg, hasbits, table);\n  auto& field = ::$proto_ns$::internal::TcParser::RefAt<$classtype$*>(msg, data.offset());\n  if (field == nullptr)\n    field = CreateMaybeMessage<$classtype$>(ctx->data().arena);\n  return ctx->ParseMessage(field, ptr);\n}\n#endif  // PROTOBUF_TC_STATIC_PARSE_SINGULAR$1$\n"
               ,(int *)((long)aiStack_80 + lVar1),(char **)((long)&local_88 + lVar1));
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x20);
  lVar1 = 0;
  do {
    Formatter::operator()
              (format,
               "#if PROTOBUF_TC_STATIC_PARSE_REPEATED$1$\nconst char* $classname$::Tct_ParseR$1$(PROTOBUF_TC_PARAM_DECL) {\n  if (PROTOBUF_PREDICT_FALSE(data.coded_tag<$2$>() != 0)) {\n    PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);\n  }\n  ptr += $1$;\n  auto& field = ::$proto_ns$::internal::TcParser::RefAt<::$proto_ns$::RepeatedPtrField<$classname$>>(msg, data.offset());\n  ::$proto_ns$::internal::TcParser::SyncHasbits(msg, hasbits, table);\n  ptr = ctx->ParseMessage(field.Add(), ptr);\n  return ptr;\n}\n#endif  // PROTOBUF_TC_STATIC_PARSE_REPEATED$1$\n"
               ,(int *)((long)aiStack_80 + lVar1),(char **)((long)&local_88 + lVar1));
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x20);
  return;
}

Assistant:

void ParseFunctionGenerator::GenerateTailcallFieldParseFunctions(
    Formatter& format) {
  GOOGLE_CHECK(should_generate_tctable());
  // There are four cases where a tailcall target are needed for messages:
  //   {singular, repeated} x {1, 2}-byte tag
  struct {
    const char* type;
    int size;
  } const kTagLayouts[] = {
      {"uint8_t", 1},
      {"uint16_t", 2},
  };
  // Singular:
  for (const auto& layout : kTagLayouts) {
    // Guard macros are defined in port_def.inc.
    format(
        "#if PROTOBUF_TC_STATIC_PARSE_SINGULAR$1$\n"
        "const char* $classname$::Tct_ParseS$1$(PROTOBUF_TC_PARAM_DECL) {\n"
        "  if (PROTOBUF_PREDICT_FALSE(data.coded_tag<$2$>() != 0))\n"
        "    PROTOBUF_MUSTTAIL "
        "return table->fallback(PROTOBUF_TC_PARAM_PASS);\n"
        "  ptr += $1$;\n"
        "  hasbits |= (uint64_t{1} << data.hasbit_idx());\n"
        "  ::$proto_ns$::internal::TcParser::SyncHasbits"
        "(msg, hasbits, table);\n"
        "  auto& field = ::$proto_ns$::internal::TcParser::"
        "RefAt<$classtype$*>(msg, data.offset());\n"
        "  if (field == nullptr)\n"
        "    field = CreateMaybeMessage<$classtype$>(ctx->data().arena);\n"
        "  return ctx->ParseMessage(field, ptr);\n"
        "}\n"
        "#endif  // PROTOBUF_TC_STATIC_PARSE_SINGULAR$1$\n",
        layout.size, layout.type);
  }
  // Repeated:
  for (const auto& layout : kTagLayouts) {
    // Guard macros are defined in port_def.inc.
    format(
        "#if PROTOBUF_TC_STATIC_PARSE_REPEATED$1$\n"
        "const char* $classname$::Tct_ParseR$1$(PROTOBUF_TC_PARAM_DECL) {\n"
        "  if (PROTOBUF_PREDICT_FALSE(data.coded_tag<$2$>() != 0)) {\n"
        "    PROTOBUF_MUSTTAIL "
        "return table->fallback(PROTOBUF_TC_PARAM_PASS);\n"
        "  }\n"
        "  ptr += $1$;\n"
        "  auto& field = ::$proto_ns$::internal::TcParser::RefAt<"
        "::$proto_ns$::RepeatedPtrField<$classname$>>(msg, data.offset());\n"
        "  ::$proto_ns$::internal::TcParser::SyncHasbits"
        "(msg, hasbits, table);\n"
        "  ptr = ctx->ParseMessage(field.Add(), ptr);\n"
        "  return ptr;\n"
        "}\n"
        "#endif  // PROTOBUF_TC_STATIC_PARSE_REPEATED$1$\n",
        layout.size, layout.type);
  }
}